

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFont::BuildLookupTable(ImFont *this)

{
  ushort uVar1;
  int iVar2;
  float *pfVar3;
  unsigned_short *ptr;
  bool bVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  uint uVar11;
  ImFontGlyph *pIVar12;
  ImFontGlyph *pIVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  int i;
  uint uVar20;
  ulong uVar21;
  float fVar22;
  
  uVar19 = (this->Glyphs).Size;
  uVar21 = (ulong)uVar19;
  if (uVar19 == 0) {
    bVar4 = true;
    uVar19 = 0;
  }
  else {
    lVar16 = 0;
    uVar17 = 0;
    uVar19 = 0;
    do {
      if ((long)(int)uVar21 <= (long)uVar17) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
      }
      uVar11 = *(uint *)(&((this->Glyphs).Data)->field_0x0 + lVar16) & 0x7fffffff;
      if (uVar19 <= uVar11) {
        uVar19 = uVar11;
      }
      uVar17 = uVar17 + 1;
      uVar11 = (this->Glyphs).Size;
      uVar21 = (ulong)uVar11;
      lVar16 = lVar16 + 0x28;
    } while (uVar17 != uVar21);
    bVar4 = (int)uVar11 < 0xffff;
  }
  if (!bVar4) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0xb04,"BuildLookupTable","ImGui ASSERT FAILED: %s","Glyphs.Size < 0xFFFF");
  }
  pfVar3 = (this->IndexAdvanceX).Data;
  if (pfVar3 != (float *)0x0) {
    (this->IndexAdvanceX).Size = 0;
    (this->IndexAdvanceX).Capacity = 0;
    ImGui::MemFree(pfVar3);
    (this->IndexAdvanceX).Data = (float *)0x0;
  }
  ptr = (this->IndexLookup).Data;
  if (ptr != (unsigned_short *)0x0) {
    (this->IndexLookup).Size = 0;
    (this->IndexLookup).Capacity = 0;
    ImGui::MemFree(ptr);
    (this->IndexLookup).Data = (unsigned_short *)0x0;
  }
  this->DirtyLookupTables = false;
  this->Used4kPagesMap[0] = '\0';
  this->Used4kPagesMap[1] = '\0';
  GrowIndex(this,uVar19 + 1);
  if ((this->Glyphs).Size < 1) {
    bVar4 = false;
  }
  else {
    lVar16 = 0;
    lVar18 = 0;
    do {
      uVar11 = *(uint *)(&((this->Glyphs).Data)->field_0x0 + lVar16);
      if ((this->Glyphs).Size <= lVar18) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
      }
      uVar20 = uVar11 & 0x7fffffff;
      fVar22 = *(float *)((long)&((this->Glyphs).Data)->AdvanceX + lVar16);
      if ((this->IndexAdvanceX).Size <= (int)uVar20) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
      }
      (this->IndexAdvanceX).Data[uVar20] = fVar22;
      if ((this->IndexLookup).Size <= (int)uVar20) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
      }
      (this->IndexLookup).Data[uVar20] = (unsigned_short)lVar18;
      this->Used4kPagesMap[uVar20 >> 0xf] =
           this->Used4kPagesMap[uVar20 >> 0xf] | (byte)(1 << ((byte)(uVar11 >> 0xc) & 7));
      lVar18 = lVar18 + 1;
      iVar15 = (this->Glyphs).Size;
      lVar16 = lVar16 + 0x28;
    } while (lVar18 < iVar15);
    bVar4 = 0 < iVar15;
  }
  if (((uint)(this->IndexLookup).Size < 0x21) ||
     (uVar1 = (this->IndexLookup).Data[0x20], uVar1 == 0xffff)) {
    pIVar13 = this->FallbackGlyph;
  }
  else {
    pIVar13 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
  }
  if (pIVar13 != (ImFontGlyph *)0x0) {
    if (!bVar4) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                  ,0x60e,"back","ImGui ASSERT FAILED: %s","Size > 0");
    }
    iVar15 = (this->Glyphs).Size;
    if (((undefined1  [40])(this->Glyphs).Data[(long)iVar15 + -1] & (undefined1  [40])0x7fffffff) !=
        (undefined1  [40])0x9) {
      iVar14 = iVar15 + 1;
      iVar2 = (this->Glyphs).Capacity;
      if (iVar2 <= iVar15) {
        if (iVar2 == 0) {
          iVar15 = 8;
        }
        else {
          iVar15 = iVar2 / 2 + iVar2;
        }
        if (iVar15 <= iVar14) {
          iVar15 = iVar14;
        }
        if (iVar2 < iVar15) {
          pIVar12 = (ImFontGlyph *)ImGui::MemAlloc((long)iVar15 * 0x28);
          pIVar13 = (this->Glyphs).Data;
          if (pIVar13 != (ImFontGlyph *)0x0) {
            memcpy(pIVar12,pIVar13,(long)(this->Glyphs).Size * 0x28);
            ImGui::MemFree((this->Glyphs).Data);
          }
          (this->Glyphs).Data = pIVar12;
          (this->Glyphs).Capacity = iVar15;
        }
      }
      (this->Glyphs).Size = iVar14;
    }
    if ((this->Glyphs).Size < 1) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                  ,0x60e,"back","ImGui ASSERT FAILED: %s","Size > 0");
    }
    pIVar13 = (this->Glyphs).Data;
    iVar15 = (this->Glyphs).Size;
    if (((uint)(this->IndexLookup).Size < 0x21) ||
       (uVar1 = (this->IndexLookup).Data[0x20], uVar1 == 0xffff)) {
      pIVar12 = this->FallbackGlyph;
    }
    else {
      pIVar12 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
    }
    fVar22 = pIVar12->V1;
    pIVar13[(long)iVar15 + -1].U1 = pIVar12->U1;
    pIVar13[(long)iVar15 + -1].V1 = fVar22;
    uVar7 = *(undefined4 *)&pIVar12->field_0x0;
    fVar8 = pIVar12->AdvanceX;
    fVar9 = pIVar12->X0;
    fVar10 = pIVar12->Y0;
    fVar22 = pIVar12->Y1;
    fVar5 = pIVar12->U0;
    fVar6 = pIVar12->V0;
    pIVar13[(long)iVar15 + -1].X1 = pIVar12->X1;
    pIVar13[(long)iVar15 + -1].Y1 = fVar22;
    pIVar13[(long)iVar15 + -1].U0 = fVar5;
    pIVar13[(long)iVar15 + -1].V0 = fVar6;
    *(undefined4 *)&pIVar13[(long)iVar15 + -1].field_0x0 = uVar7;
    pIVar13[(long)iVar15 + -1].AdvanceX = fVar8;
    pIVar13[(long)iVar15 + -1].X0 = fVar9;
    pIVar13[(long)iVar15 + -1].Y0 = fVar10;
    *(uint *)(pIVar13 + (long)iVar15 + -1) = *(uint *)(pIVar13 + (long)iVar15 + -1) & 0x80000000 | 9
    ;
    fVar22 = pIVar13[(long)iVar15 + -1].AdvanceX * 4.0;
    pIVar13[(long)iVar15 + -1].AdvanceX = fVar22;
    if ((this->IndexAdvanceX).Size < 10) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                  ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
    }
    (this->IndexAdvanceX).Data[9] = fVar22;
    iVar2 = (this->Glyphs).Size;
    uVar11 = *(uint *)(pIVar13 + (long)iVar15 + -1);
    if ((this->IndexLookup).Size <= (int)(uVar11 & 0x7fffffff)) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                  ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
    }
    (this->IndexLookup).Data[uVar11 & 0x7fffffff] = (short)iVar2 - 1;
  }
  if (((uint)(this->IndexLookup).Size < 0x21) ||
     (uVar1 = (this->IndexLookup).Data[0x20], uVar1 == 0xffff)) {
    pIVar13 = this->FallbackGlyph;
  }
  else {
    pIVar13 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
  }
  if (pIVar13 != (ImFontGlyph *)0x0) {
    pIVar13->field_0x3 = pIVar13->field_0x3 & 0x7f;
  }
  if (((uint)(this->IndexLookup).Size < 10) ||
     (uVar1 = (this->IndexLookup).Data[9], uVar1 == 0xffff)) {
    pIVar13 = this->FallbackGlyph;
  }
  else {
    pIVar13 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
  }
  if (pIVar13 != (ImFontGlyph *)0x0) {
    pIVar13->field_0x3 = pIVar13->field_0x3 & 0x7f;
  }
  if ((ulong)this->FallbackChar < (ulong)(long)(this->IndexLookup).Size) {
    uVar1 = (this->IndexLookup).Data[this->FallbackChar];
    pIVar13 = (ImFontGlyph *)0x0;
    if (uVar1 != 0xffff) {
      pIVar13 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
    }
  }
  else {
    pIVar13 = (ImFontGlyph *)0x0;
  }
  this->FallbackGlyph = pIVar13;
  fVar22 = 0.0;
  if (pIVar13 != (ImFontGlyph *)0x0) {
    fVar22 = pIVar13->AdvanceX;
  }
  this->FallbackAdvanceX = fVar22;
  uVar21 = 0;
  do {
    if ((long)(this->IndexAdvanceX).Size <= (long)uVar21) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                  ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
    }
    pfVar3 = (this->IndexAdvanceX).Data + uVar21;
    if (*pfVar3 <= 0.0 && *pfVar3 != 0.0) {
      fVar22 = this->FallbackAdvanceX;
      if ((long)(this->IndexAdvanceX).Size <= (long)uVar21) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
      }
      (this->IndexAdvanceX).Data[uVar21] = fVar22;
    }
    uVar21 = uVar21 + 1;
  } while (uVar19 + 1 != uVar21);
  return;
}

Assistant:

void ImFont::BuildLookupTable()
{
    int max_codepoint = 0;
    for (int i = 0; i != Glyphs.Size; i++)
        max_codepoint = ImMax(max_codepoint, (int)Glyphs[i].Codepoint);

    // Build lookup table
    IM_ASSERT(Glyphs.Size < 0xFFFF); // -1 is reserved
    IndexAdvanceX.clear();
    IndexLookup.clear();
    DirtyLookupTables = false;
    memset(Used4kPagesMap, 0, sizeof(Used4kPagesMap));
    GrowIndex(max_codepoint + 1);
    for (int i = 0; i < Glyphs.Size; i++)
    {
        int codepoint = (int)Glyphs[i].Codepoint;
        IndexAdvanceX[codepoint] = Glyphs[i].AdvanceX;
        IndexLookup[codepoint] = (ImWchar)i;

        // Mark 4K page as used
        const int page_n = codepoint / 4096;
        Used4kPagesMap[page_n >> 3] |= 1 << (page_n & 7);
    }

    // Create a glyph to handle TAB
    // FIXME: Needs proper TAB handling but it needs to be contextualized (or we could arbitrary say that each string starts at "column 0" ?)
    if (FindGlyph((ImWchar)' '))
    {
        if (Glyphs.back().Codepoint != '\t')   // So we can call this function multiple times (FIXME: Flaky)
            Glyphs.resize(Glyphs.Size + 1);
        ImFontGlyph& tab_glyph = Glyphs.back();
        tab_glyph = *FindGlyph((ImWchar)' ');
        tab_glyph.Codepoint = '\t';
        tab_glyph.AdvanceX *= IM_TABSIZE;
        IndexAdvanceX[(int)tab_glyph.Codepoint] = (float)tab_glyph.AdvanceX;
        IndexLookup[(int)tab_glyph.Codepoint] = (ImWchar)(Glyphs.Size - 1);
    }

    // Mark special glyphs as not visible (note that AddGlyph already mark as non-visible glyphs with zero-size polygons)
    SetGlyphVisible((ImWchar)' ', false);
    SetGlyphVisible((ImWchar)'\t', false);

    // Setup fall-backs
    FallbackGlyph = FindGlyphNoFallback(FallbackChar);
    FallbackAdvanceX = FallbackGlyph ? FallbackGlyph->AdvanceX : 0.0f;
    for (int i = 0; i < max_codepoint + 1; i++)
        if (IndexAdvanceX[i] < 0.0f)
            IndexAdvanceX[i] = FallbackAdvanceX;
}